

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O0

FxExpression * __thiscall FxBoolCast::Resolve(FxBoolCast *this,FCompileContext *ctx)

{
  bool val;
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  FxExpression *x_1;
  ExpVal constval;
  FxExpression *x;
  FCompileContext *ctx_local;
  FxBoolCast *this_local;
  
  this_local = this;
  if (((this->super_FxExpression).isresolved & 1U) == 0) {
    (this->super_FxExpression).isresolved = true;
    if (this->basex != (FxExpression *)0x0) {
      iVar1 = (*this->basex->_vptr_FxExpression[2])(this->basex,ctx);
      this->basex = (FxExpression *)CONCAT44(extraout_var,iVar1);
    }
    if (this->basex == (FxExpression *)0x0) {
      if (this != (FxBoolCast *)0x0) {
        (*(this->super_FxExpression)._vptr_FxExpression[1])();
      }
      this_local = (FxBoolCast *)0x0;
    }
    else if (this->basex->ValueType == (PType *)TypeBool) {
      constval.field_1 = (anon_union_8_3_addc324a_for_ExpVal_1)this->basex;
      this->basex = (FxExpression *)0x0;
      if (this != (FxBoolCast *)0x0) {
        (*(this->super_FxExpression)._vptr_FxExpression[1])();
      }
      this_local = (FxBoolCast *)constval.field_1.pointer;
    }
    else {
      iVar1 = (*(this->basex->ValueType->super_DObject)._vptr_DObject[0x12])();
      if (((iVar1 == 0) ||
          (iVar1 = (*(this->basex->ValueType->super_DObject)._vptr_DObject[0x12])(), iVar1 == 1)) ||
         (iVar1 = (*(this->basex->ValueType->super_DObject)._vptr_DObject[0x12])(), iVar1 == 3)) {
        uVar2 = (*this->basex->_vptr_FxExpression[3])();
        if ((uVar2 & 1) != 0) {
          if (this->basex->ValueType == (PType *)TypeState) {
            __assert_fail("basex->ValueType != TypeState && \"We shouldn\'t be able to generate a constant state ref\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_expression.cpp"
                          ,0x1ba,"virtual FxExpression *FxBoolCast::Resolve(FCompileContext &)");
          }
          FxConstant::GetValue((FxConstant *)&x_1);
          this_local = (FxBoolCast *)operator_new(0x48);
          val = ExpVal::GetBool((ExpVal *)&x_1);
          FxConstant::FxConstant
                    ((FxConstant *)this_local,val,&(this->super_FxExpression).ScriptPosition);
          if (this != (FxBoolCast *)0x0) {
            (*(this->super_FxExpression)._vptr_FxExpression[1])();
          }
          ExpVal::~ExpVal((ExpVal *)&x_1);
        }
      }
      else {
        FScriptPosition::Message
                  (&(this->super_FxExpression).ScriptPosition,2,"Numeric type expected");
        if (this != (FxBoolCast *)0x0) {
          (*(this->super_FxExpression)._vptr_FxExpression[1])();
        }
        this_local = (FxBoolCast *)0x0;
      }
    }
  }
  return &this_local->super_FxExpression;
}

Assistant:

FxExpression *FxBoolCast::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(basex, ctx);

	if (basex->ValueType == TypeBool)
	{
		FxExpression *x = basex;
		basex = nullptr;
		delete this;
		return x;
	}
	else if (basex->ValueType->GetRegType() == REGT_INT || basex->ValueType->GetRegType() == REGT_FLOAT || basex->ValueType->GetRegType() == REGT_POINTER)
	{
		if (basex->isConstant())
		{
			assert(basex->ValueType != TypeState && "We shouldn't be able to generate a constant state ref");

			ExpVal constval = static_cast<FxConstant *>(basex)->GetValue();
			FxExpression *x = new FxConstant(constval.GetBool(), ScriptPosition);
			delete this;
			return x;
		}
		return this;
	}
	ScriptPosition.Message(MSG_ERROR, "Numeric type expected");
	delete this;
	return nullptr;
}